

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexTriangleKernel.cpp
# Opt level: O3

void Ptex::v2_4::anon_unknown_2::ApplyN<float>
               (PtexTriangleKernelIter *k,float *result,void *data,int nChan,int nTxChan)

{
  float fVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  void *pvVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  
  iVar10 = k->v1;
  iVar4 = k->v2;
  if (iVar10 != iVar4) {
    fVar1 = k->A;
    iVar6 = -iVar10;
    do {
      iVar2 = k->rowlen;
      iVar3 = k->u1;
      iVar9 = (iVar2 - iVar10) - k->w2;
      if (iVar9 < iVar3) {
        iVar9 = iVar3;
      }
      iVar8 = (iVar2 - iVar10) - k->w1;
      if (k->u2 < iVar8) {
        iVar8 = k->u2;
      }
      iVar8 = (iVar8 - iVar9) * nTxChan;
      if (0 < iVar8) {
        fVar12 = (float)iVar9 - k->u;
        fVar11 = (float)iVar10 - k->v;
        fVar13 = fVar12 * k->A * fVar12 + (k->B * fVar12 + k->C * fVar11) * fVar11;
        fVar11 = (fVar12 + fVar12 + 1.0) * k->A + fVar11 * k->B;
        iVar4 = (iVar2 + iVar6) - k->w2;
        if (iVar4 < iVar3) {
          iVar4 = iVar3;
        }
        pvVar7 = (void *)((long)data + (long)((iVar4 + iVar2 * iVar10) * nTxChan) * 4);
        do {
          if (fVar13 < 1.0) {
            fVar12 = expf(fVar13 * -6.125);
            fVar12 = fVar12 * k->wscale;
            k->weight = k->weight + fVar12;
            if (0 < nChan) {
              uVar5 = 0;
              do {
                result[uVar5] = *(float *)((long)pvVar7 + uVar5 * 4) * fVar12 + result[uVar5];
                uVar5 = uVar5 + 1;
              } while ((uint)nChan != uVar5);
            }
          }
          fVar13 = fVar13 + fVar11;
          fVar11 = fVar11 + fVar1 + fVar1;
          pvVar7 = (void *)((long)pvVar7 + (long)nTxChan * 4);
        } while (pvVar7 < (void *)((long)data +
                                  (long)iVar8 * 4 + (long)((iVar9 + iVar2 * iVar10) * nTxChan) * 4))
        ;
        iVar4 = k->v2;
      }
      iVar10 = iVar10 + 1;
      iVar6 = iVar6 + -1;
    } while (iVar10 != iVar4);
  }
  return;
}

Assistant:

void ApplyN(PtexTriangleKernelIter& k, float* result, void* data, int nChan, int nTxChan)
    {
        float DDQ = 2.0f*k.A;
        for (int vi = k.v1; vi != k.v2; vi++) {
            int xw = k.rowlen - vi;
            int x1 = PtexUtils::max(k.u1, xw-k.w2);
            int x2 = PtexUtils::min(k.u2, xw-k.w1);
            float U = (float)x1 - k.u;
            float V = (float)vi - k.v;
            float DQ = k.A*(2.0f*U+1.0f)+k.B*V;
            float Q = k.A*U*U + (k.B*U + k.C*V)*V;
            T* p = static_cast<T*>(data) + (vi * k.rowlen + x1) * nTxChan;
            T* pEnd = p + (x2-x1)*nTxChan;
            for (; p < pEnd; p += nTxChan) {
                if (Q < 1.0f) {
                    float weight = gaussian(Q)*k.wscale;
                    k.weight += weight;
                    PtexUtils::VecAccumN<T>()(result, p, nChan, weight);
                }
                Q += DQ;
                DQ += DDQ;
            }
        }
    }